

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::SetCommonFieldVariables
          (FieldGeneratorBase *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *variables)

{
  uint32 value;
  bool bVar1;
  FieldType type;
  Type TVar2;
  size_t sVar3;
  mapped_type *pmVar4;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  AlphaNum *a_02;
  AlphaNum *a_03;
  AlphaNum *a_04;
  AlphaNum *a_05;
  Descriptor *descriptor;
  AlphaNum *a_06;
  AlphaNum *a_07;
  int iVar5;
  int i;
  long lVar6;
  string *psVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar8;
  FieldGeneratorBase *this_00;
  allocator local_171;
  string hasBitsNumber;
  string hasBitsMask;
  AlphaNum local_130;
  key_type local_100;
  uint32 local_dc;
  allocator local_d6;
  uint8 tag_array [5];
  key_type local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_90;
  FieldGeneratorBase *local_88;
  long local_80;
  key_type local_78;
  size_t local_58;
  string tag_bytes;
  
  iVar5 = *(int *)(this->descriptor_ + 0x44);
  local_90 = variables;
  type = FieldDescriptor::type(this->descriptor_);
  sVar3 = internal::WireFormatLite::TagSize(iVar5,type);
  TVar2 = FieldDescriptor::type(this->descriptor_);
  iVar5 = (int)((long)((ulong)(uint)((int)sVar3 >> 0x1f) << 0x20 | sVar3 & 0xffffffff) / 2);
  if (TVar2 != TYPE_GROUP) {
    iVar5 = (int)sVar3;
  }
  local_88 = this;
  local_58 = sVar3;
  local_dc = internal::WireFormat::MakeTag(this->descriptor_);
  io::CodedOutputStream::WriteVarint32ToArray(local_dc,tag_array);
  strings::AlphaNum::AlphaNum(&local_130,(uint)tag_array[0]);
  StrCat_abi_cxx11_(&tag_bytes,(protobuf *)&local_130,a);
  local_80 = (long)iVar5;
  for (lVar6 = 1; lVar6 < local_80; lVar6 = lVar6 + 1) {
    strings::AlphaNum::AlphaNum(&local_130,(uint)tag_array[lVar6]);
    StrCat_abi_cxx11_(&hasBitsMask,(protobuf *)&local_130,a_00);
    std::operator+(&hasBitsNumber,", ",&hasBitsMask);
    std::__cxx11::string::append((string *)&tag_bytes);
    std::__cxx11::string::~string((string *)&hasBitsNumber);
    std::__cxx11::string::~string((string *)&hasBitsMask);
  }
  strings::AlphaNum::AlphaNum(&local_130,local_dc);
  StrCat_abi_cxx11_(&hasBitsNumber,(protobuf *)&local_130,a_01);
  std::__cxx11::string::string((string *)&hasBitsMask,"tag",(allocator *)&local_100);
  this_00 = local_88;
  pmVar8 = local_90;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](local_90,&hasBitsMask);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&hasBitsNumber);
  std::__cxx11::string::~string((string *)&hasBitsMask);
  std::__cxx11::string::~string((string *)&hasBitsNumber);
  strings::AlphaNum::AlphaNum(&local_130,(int)local_58);
  StrCat_abi_cxx11_(&hasBitsNumber,(protobuf *)&local_130,a_02);
  std::__cxx11::string::string((string *)&hasBitsMask,"tag_size",(allocator *)&local_100);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar8,&hasBitsMask);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&hasBitsNumber);
  std::__cxx11::string::~string((string *)&hasBitsMask);
  std::__cxx11::string::~string((string *)&hasBitsNumber);
  std::__cxx11::string::string((string *)&local_130,"tag_bytes",(allocator *)&hasBitsNumber);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar8,(key_type *)&local_130);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  std::__cxx11::string::~string((string *)&local_130);
  TVar2 = FieldDescriptor::type(this_00->descriptor_);
  if (TVar2 == TYPE_GROUP) {
    value = *(int *)(this_00->descriptor_ + 0x44) * 8 + 4;
    io::CodedOutputStream::WriteVarint32ToArray(value,tag_array);
    local_dc = value;
    strings::AlphaNum::AlphaNum(&local_130,(uint)tag_array[0]);
    StrCat_abi_cxx11_(&hasBitsNumber,(protobuf *)&local_130,a_03);
    std::__cxx11::string::operator=((string *)&tag_bytes,(string *)&hasBitsNumber);
    std::__cxx11::string::~string((string *)&hasBitsNumber);
    for (lVar6 = 1; lVar6 < local_80; lVar6 = lVar6 + 1) {
      strings::AlphaNum::AlphaNum(&local_130,(uint)tag_array[lVar6]);
      StrCat_abi_cxx11_(&hasBitsMask,(protobuf *)&local_130,a_04);
      std::operator+(&hasBitsNumber,", ",&hasBitsMask);
      std::__cxx11::string::append((string *)&tag_bytes);
      std::__cxx11::string::~string((string *)&hasBitsNumber);
      std::__cxx11::string::~string((string *)&hasBitsMask);
    }
    strings::AlphaNum::AlphaNum(&local_130,local_dc);
    StrCat_abi_cxx11_(&hasBitsNumber,(protobuf *)&local_130,a_05);
    std::__cxx11::string::string((string *)&hasBitsMask,"end_tag",(allocator *)&local_100);
    this_00 = local_88;
    pmVar8 = &local_88->variables_;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&hasBitsMask);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&hasBitsNumber);
    std::__cxx11::string::~string((string *)&hasBitsMask);
    std::__cxx11::string::~string((string *)&hasBitsNumber);
    std::__cxx11::string::string((string *)&local_130,"end_tag_bytes",(allocator *)&hasBitsNumber);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,(key_type *)&local_130);
    pmVar8 = local_90;
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::__cxx11::string::~string((string *)&local_130);
  }
  std::__cxx11::string::string((string *)&local_130,"access_level",(allocator *)&hasBitsNumber);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar8,(key_type *)&local_130);
  std::__cxx11::string::assign((char *)pmVar4);
  std::__cxx11::string::~string((string *)&local_130);
  property_name_abi_cxx11_((string *)&local_130,this_00);
  std::__cxx11::string::string((string *)&hasBitsNumber,"property_name",(allocator *)&hasBitsMask);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar8,&hasBitsNumber);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_130);
  std::__cxx11::string::~string((string *)&hasBitsNumber);
  std::__cxx11::string::~string((string *)&local_130);
  type_name_abi_cxx11_((string *)&local_130,this_00);
  std::__cxx11::string::string((string *)&hasBitsNumber,"type_name",(allocator *)&hasBitsMask);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar8,&hasBitsNumber);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_130);
  std::__cxx11::string::~string((string *)&hasBitsNumber);
  std::__cxx11::string::~string((string *)&local_130);
  GetClassName_abi_cxx11_((string *)&local_130,*(csharp **)(this_00->descriptor_ + 0x50),descriptor)
  ;
  std::__cxx11::string::string((string *)&hasBitsNumber,"extended_type",(allocator *)&hasBitsMask);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar8,&hasBitsNumber);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_130);
  std::__cxx11::string::~string((string *)&hasBitsNumber);
  std::__cxx11::string::~string((string *)&local_130);
  name_abi_cxx11_((string *)&local_130,this_00);
  std::__cxx11::string::string((string *)&hasBitsNumber,"name",(allocator *)&hasBitsMask);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar8,&hasBitsNumber);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_130);
  std::__cxx11::string::~string((string *)&hasBitsNumber);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string((string *)&local_130,"descriptor_name",(allocator *)&hasBitsNumber);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar8,(key_type *)&local_130);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  std::__cxx11::string::~string((string *)&local_130);
  default_value_abi_cxx11_((string *)&local_130,this_00);
  std::__cxx11::string::string((string *)&hasBitsNumber,"default_value",(allocator *)&hasBitsMask);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar8,&hasBitsNumber);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_130);
  std::__cxx11::string::~string((string *)&hasBitsNumber);
  std::__cxx11::string::~string((string *)&local_130);
  capitalized_type_name_abi_cxx11_((string *)&local_130,this_00);
  std::__cxx11::string::string
            ((string *)&hasBitsNumber,"capitalized_type_name",(allocator *)&hasBitsMask);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar8,&hasBitsNumber);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_130);
  std::__cxx11::string::~string((string *)&hasBitsNumber);
  std::__cxx11::string::~string((string *)&local_130);
  number_abi_cxx11_((string *)&local_130,this_00);
  std::__cxx11::string::string((string *)&hasBitsNumber,"number",(allocator *)&hasBitsMask);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar8,&hasBitsNumber);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_130);
  std::__cxx11::string::~string((string *)&hasBitsNumber);
  std::__cxx11::string::~string((string *)&local_130);
  bVar1 = has_default_value(this_00);
  if ((bVar1) && (*(int *)(*(long *)(this_00->descriptor_ + 0x28) + 0x3c) != 2)) {
    std::__cxx11::string::string((string *)&hasBitsMask,"name",(allocator *)&local_b0);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&hasBitsMask);
    std::operator+(&hasBitsNumber,pmVar4,"_ = ");
    std::__cxx11::string::string((string *)&local_100,"default_value",(allocator *)&local_78);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&local_100);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   &hasBitsNumber,pmVar4);
    std::__cxx11::string::string((string *)&local_d0,"name_def_message",&local_171);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&local_d0);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&hasBitsNumber);
    psVar7 = &hasBitsMask;
  }
  else {
    std::__cxx11::string::string((string *)&hasBitsNumber,"name",(allocator *)&local_100);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&hasBitsNumber);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   pmVar4,"_");
    std::__cxx11::string::string((string *)&hasBitsMask,"name_def_message",(allocator *)&local_d0);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&hasBitsMask);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_130);
    std::__cxx11::string::~string((string *)&hasBitsMask);
    std::__cxx11::string::~string((string *)&local_130);
    psVar7 = &hasBitsNumber;
  }
  std::__cxx11::string::~string((string *)psVar7);
  if (*(int *)(*(long *)(this_00->descriptor_ + 0x28) + 0x3c) == 2) {
    std::__cxx11::string::string((string *)&hasBitsNumber,"property_name",(allocator *)&local_100);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&hasBitsNumber);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   "Has",pmVar4);
    std::__cxx11::string::string((string *)&hasBitsMask,"has_property_check",(allocator *)&local_d0)
    ;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&hasBitsMask);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_130);
    std::__cxx11::string::~string((string *)&hasBitsMask);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&hasBitsNumber);
    std::__cxx11::string::string((string *)&hasBitsNumber,"property_name",(allocator *)&local_100);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&hasBitsNumber);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   "other.Has",pmVar4);
    std::__cxx11::string::string
              ((string *)&hasBitsMask,"other_has_property_check",(allocator *)&local_d0);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&hasBitsMask);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_130);
    std::__cxx11::string::~string((string *)&hasBitsMask);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&hasBitsNumber);
    std::__cxx11::string::string
              ((string *)&hasBitsNumber,"has_property_check",(allocator *)&local_100);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&hasBitsNumber);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   "!",pmVar4);
    std::__cxx11::string::string
              ((string *)&hasBitsMask,"has_not_property_check",(allocator *)&local_d0);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&hasBitsMask);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_130);
    std::__cxx11::string::~string((string *)&hasBitsMask);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&hasBitsNumber);
    std::__cxx11::string::string
              ((string *)&hasBitsNumber,"other_has_property_check",(allocator *)&local_100);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&hasBitsNumber);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   "!",pmVar4);
    std::__cxx11::string::string
              ((string *)&hasBitsMask,"other_has_not_property_check",(allocator *)&local_d0);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&hasBitsMask);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_130);
    std::__cxx11::string::~string((string *)&hasBitsMask);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&hasBitsNumber);
    if (this_00->presenceIndex_ == -1) goto LAB_002cd5b7;
    strings::AlphaNum::AlphaNum(&local_130,this_00->presenceIndex_ / 0x20);
    StrCat_abi_cxx11_(&hasBitsNumber,(protobuf *)&local_130,a_06);
    strings::AlphaNum::AlphaNum(&local_130,1 << ((byte)this_00->presenceIndex_ & 0x1f));
    StrCat_abi_cxx11_(&hasBitsMask,(protobuf *)&local_130,a_07);
    std::operator+(&local_b0,"(_hasBits",&hasBitsNumber);
    std::operator+(&local_d0,&local_b0," & ");
    std::operator+(&local_100,&local_d0,&hasBitsMask);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   &local_100,") != 0");
    std::__cxx11::string::string((string *)&local_78,"has_field_check",&local_171);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&local_78);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::operator+(&local_d0,"_hasBits",&hasBitsNumber);
    std::operator+(&local_100,&local_d0," |= ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   &local_100,&hasBitsMask);
    std::__cxx11::string::string((string *)&local_b0,"set_has_field",(allocator *)&local_78);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&local_b0);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_d0);
    std::operator+(&local_d0,"_hasBits",&hasBitsNumber);
    std::operator+(&local_100,&local_d0," &= ~");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   &local_100,&hasBitsMask);
    std::__cxx11::string::string((string *)&local_b0,"clear_has_field",(allocator *)&local_78);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&local_b0);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&hasBitsMask);
    psVar7 = &hasBitsNumber;
  }
  else {
    std::__cxx11::string::string((string *)&hasBitsMask,"property_name",(allocator *)&local_b0);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&hasBitsMask);
    std::operator+(&hasBitsNumber,pmVar4," != ");
    std::__cxx11::string::string((string *)&local_100,"default_value",(allocator *)&local_78);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&local_100);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   &hasBitsNumber,pmVar4);
    std::__cxx11::string::string((string *)&local_d0,"has_property_check",&local_171);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&local_d0);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&hasBitsNumber);
    std::__cxx11::string::~string((string *)&hasBitsMask);
    std::__cxx11::string::string((string *)&local_100,"property_name",(allocator *)&local_78);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&local_100);
    std::operator+(&hasBitsMask,"other.",pmVar4);
    std::operator+(&hasBitsNumber,&hasBitsMask," != ");
    std::__cxx11::string::string((string *)&local_d0,"default_value",&local_171);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&local_d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130,
                   &hasBitsNumber,pmVar4);
    std::__cxx11::string::string((string *)&local_b0,"other_has_property_check",&local_d6);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](pmVar8,&local_b0);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&hasBitsNumber);
    std::__cxx11::string::~string((string *)&hasBitsMask);
    psVar7 = &local_100;
  }
  std::__cxx11::string::~string((string *)psVar7);
LAB_002cd5b7:
  std::__cxx11::string::~string((string *)&tag_bytes);
  return;
}

Assistant:

void FieldGeneratorBase::SetCommonFieldVariables(
    std::map<string, string>* variables) {
  // Note: this will be valid even though the tag emitted for packed and unpacked versions of
  // repeated fields varies by wire format. The wire format is encoded in the bottom 3 bits, which
  // never effects the tag size.
  int tag_size = internal::WireFormat::TagSize(descriptor_->number(), descriptor_->type());
  int part_tag_size = tag_size;
  if (descriptor_->type() == FieldDescriptor::TYPE_GROUP) {
    part_tag_size /= 2;
  }
  uint tag = internal::WireFormat::MakeTag(descriptor_);
  uint8 tag_array[5];
  io::CodedOutputStream::WriteTagToArray(tag, tag_array);
  string tag_bytes = StrCat(tag_array[0]);
  for (int i = 1; i < part_tag_size; i++) {
    tag_bytes += ", " + StrCat(tag_array[i]);
  }

  (*variables)["tag"] = StrCat(tag);
  (*variables)["tag_size"] = StrCat(tag_size);
  (*variables)["tag_bytes"] = tag_bytes;

  if (descriptor_->type() == FieldDescriptor::Type::TYPE_GROUP) {
    tag = internal::WireFormatLite::MakeTag(
        descriptor_->number(),
        internal::WireFormatLite::WIRETYPE_END_GROUP);
    io::CodedOutputStream::WriteTagToArray(tag, tag_array);
    tag_bytes = StrCat(tag_array[0]);
    for (int i = 1; i < part_tag_size; i++) {
        tag_bytes += ", " + StrCat(tag_array[i]);
    }

    variables_["end_tag"] = StrCat(tag);
    variables_["end_tag_bytes"] = tag_bytes;
  }

  (*variables)["access_level"] = "public";

  (*variables)["property_name"] = property_name();
  (*variables)["type_name"] = type_name();
  (*variables)["extended_type"] = GetClassName(descriptor_->containing_type());
  (*variables)["name"] = name();
  (*variables)["descriptor_name"] = descriptor_->name();
  (*variables)["default_value"] = default_value();
  (*variables)["capitalized_type_name"] = capitalized_type_name();
  (*variables)["number"] = number();
  if (has_default_value() && !IsProto2(descriptor_->file())) {
    (*variables)["name_def_message"] =
      (*variables)["name"] + "_ = " + (*variables)["default_value"];
  } else {
    (*variables)["name_def_message"] = (*variables)["name"] + "_";
  }
  if (IsProto2(descriptor_->file())) {
    (*variables)["has_property_check"] = "Has" + (*variables)["property_name"];
    (*variables)["other_has_property_check"] = "other.Has" + (*variables)["property_name"];
    (*variables)["has_not_property_check"] = "!" + (*variables)["has_property_check"];
    (*variables)["other_has_not_property_check"] = "!" + (*variables)["other_has_property_check"];
    if (presenceIndex_ != -1) {
      string hasBitsNumber = StrCat(presenceIndex_ / 32);
      string hasBitsMask = StrCat(1 << (presenceIndex_ % 32));
      (*variables)["has_field_check"] = "(_hasBits" + hasBitsNumber + " & " + hasBitsMask + ") != 0";
      (*variables)["set_has_field"] = "_hasBits" + hasBitsNumber + " |= " + hasBitsMask;
      (*variables)["clear_has_field"] = "_hasBits" + hasBitsNumber + " &= ~" + hasBitsMask;
    }
  } else {
    (*variables)["has_property_check"] =
      (*variables)["property_name"] + " != " + (*variables)["default_value"];
    (*variables)["other_has_property_check"] = "other." +
      (*variables)["property_name"] + " != " + (*variables)["default_value"];
  }
}